

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O1

MortonCode64 __thiscall Resorting::MortonCode64::operator-(MortonCode64 *this,MortonCode64 rhs)

{
  MortonCode64 MVar1;
  ulong uVar2;
  
  uVar2 = ~rhs.data;
  MVar1 = operator+(this,(MortonCode64)
                         ((uVar2 | ~(xMask * 4)) + 1 & xMask * 4 |
                         (~(xMask * 2) | uVar2) + 1 & xMask * 2 | (~xMask | uVar2) + 1 & xMask));
  return (MortonCode64)MVar1.data;
}

Assistant:

MortonCode64 MortonCode64::operator-(const MortonCode64 rhs) const
{
    return *this + rhs.Negate();
}